

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_explain_analyze.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalExplainAnalyze::Finalize
          (PhysicalExplainAnalyze *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  GlobalSinkState *pGVar1;
  QueryProfiler *this_00;
  string local_30;
  
  pGVar1 = input->global_state;
  this_00 = QueryProfiler::Get(context);
  QueryProfiler::ToString_abi_cxx11_(&local_30,this_00,this->format);
  ::std::__cxx11::string::operator=((string *)(pGVar1 + 1),(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return READY;
}

Assistant:

SinkFinalizeType PhysicalExplainAnalyze::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                  OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<ExplainAnalyzeStateGlobalState>();
	auto &profiler = QueryProfiler::Get(context);
	gstate.analyzed_plan = profiler.ToString(format);
	return SinkFinalizeType::READY;
}